

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void copy_termchar(termline *destline,wchar_t x,termchar *src)

{
  undefined4 uVar1;
  termchar *ptVar2;
  termchar *local_20;
  termchar *src_local;
  wchar_t x_local;
  termline *destline_local;
  
  clear_cc(destline,x);
  ptVar2 = destline->chars + x;
  ptVar2->chr = src->chr;
  ptVar2->attr = src->attr;
  ptVar2->truecolour = src->truecolour;
  uVar1 = *(undefined4 *)&src->field_0x1c;
  ptVar2->cc_next = src->cc_next;
  *(undefined4 *)&ptVar2->field_0x1c = uVar1;
  destline->chars[x].cc_next = L'\0';
  local_20 = src;
  while (local_20->cc_next != L'\0') {
    local_20 = local_20 + local_20->cc_next;
    add_cc(destline,x,local_20->chr);
  }
  return;
}

Assistant:

static void copy_termchar(termline *destline, int x, termchar *src)
{
    clear_cc(destline, x);

    destline->chars[x] = *src;         /* copy everything except cc-list */
    destline->chars[x].cc_next = 0;    /* and make sure this is zero */

    while (src->cc_next) {
        src += src->cc_next;
        add_cc(destline, x, src->chr);
    }

#ifdef TERM_CC_DIAGS
    cc_check(destline);
#endif
}